

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O1

RealType sSTOCoulInt(RealType a,RealType b,int m,int n,RealType R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  RealType RVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint p;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double local_128;
  double local_120;
  int local_98;
  
  dVar8 = a + a;
  dVar24 = dVar8 * R;
  if (2.220446049250313e-16 <= ABS(dVar24)) {
    local_120 = 1.0;
    uVar9 = m * 2;
    dVar6 = (double)(int)uVar9;
    dVar2 = pow(dVar24,dVar6);
    dVar8 = fact[(int)uVar9];
    iVar15 = m * 2 + -1;
    if (0 < m) {
      dVar1 = 1.0;
      dVar23 = 1.0;
      local_120 = 1.0;
      iVar10 = iVar15;
      do {
        dVar1 = dVar1 * (dVar24 / dVar23);
        local_120 = local_120 + dVar1;
        dVar23 = dVar23 + 1.0;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      local_120 = local_120 / dVar1;
    }
    dVar23 = -dVar24;
    dVar1 = exp(dVar23);
    dVar3 = exp(dVar23);
    dVar2 = (dVar2 / (dVar8 * R)) * ((dVar24 - dVar6) * (dVar1 / dVar24) * local_120 - dVar3) +
            1.0 / R + 0.0;
    dVar1 = 0.0 / dVar2;
    dVar6 = pow(a * R,dVar6);
    dVar3 = (double)n;
    if ((a != b) || (NAN(a) || NAN(b))) {
      if ((b != 0.0) || (NAN(b))) {
        dVar8 = (-a * dVar6) / ((dVar3 + dVar3) * dVar8);
        if (n < 1) {
          dVar24 = 0.0;
        }
        else {
          uVar11 = n * 2;
          dVar6 = (a - b) * R;
          dVar23 = (a + b) * R;
          uVar22 = 1;
          if (1 < (int)uVar11) {
            uVar22 = (ulong)uVar11;
          }
          uVar20 = 0;
          dVar24 = 0.0;
          local_98 = iVar15;
          uVar16 = uVar9;
          do {
            dVar3 = 0.0;
            iVar10 = (int)uVar20;
            if (-(long)(int)uVar9 < (long)uVar20) {
              local_128 = 0.0;
              iVar21 = 0;
              p = 0;
              iVar19 = local_98;
              dVar3 = 0.0;
              do {
                RVar5 = RosenD(iVar15,iVar10,p);
                if ((dVar6 != 0.0) || (NAN(dVar6))) {
                  dVar29 = exp(dVar6);
                  dVar4 = exp(-dVar6);
                  dVar29 = dVar29 - dVar4;
                  dVar4 = exp(dVar6);
                  dVar27 = exp(-dVar6);
                  dVar30 = dVar29;
                  if (p == 0) {
                    dVar28 = 1.0;
                  }
                  else {
                    uVar13 = 1;
                    dVar7 = 1.0;
                    dVar28 = 1.0;
                    do {
                      dVar25 = -dVar4 - dVar27;
                      if ((uVar13 & 1) == 0) {
                        dVar25 = dVar29;
                      }
                      dVar26 = dVar6 / dVar7;
                      dVar7 = dVar7 + 1.0;
                      dVar28 = dVar28 * dVar26;
                      dVar30 = dVar30 + dVar25 * dVar28;
                      iVar14 = uVar13 + iVar21;
                      uVar13 = uVar13 + 1;
                    } while (iVar14 != 0);
                  }
                  dVar30 = dVar30 / (dVar28 * dVar6);
                }
                else {
                  puts("WARNING, a = 0 in RosenB");
                  dVar29 = pow(-1.0,local_128);
                  dVar30 = (1.0 - dVar29) / (double)(int)(p + 1);
                }
                dVar29 = 0.0;
                if ((dVar23 != 0.0) || (NAN(dVar23))) {
                  dVar29 = 1.0;
                  if (0 < (int)(~p + uVar9 + iVar10)) {
                    dVar4 = 1.0;
                    dVar27 = 1.0;
                    dVar29 = 1.0;
                    iVar14 = iVar19;
                    do {
                      dVar27 = dVar27 * (dVar23 / dVar4);
                      dVar29 = dVar29 + dVar27;
                      dVar4 = dVar4 + 1.0;
                      iVar14 = iVar14 + -1;
                    } while (iVar14 != 0);
                    dVar29 = dVar29 / dVar27;
                  }
                  dVar4 = exp(-dVar23);
                  dVar29 = (dVar4 / dVar23) * dVar29;
                }
                dVar3 = dVar3 + RVar5 * dVar30 * dVar29;
                local_128 = local_128 + 1.0;
                p = p + 1;
                iVar21 = iVar21 + -1;
                iVar19 = iVar19 + -1;
              } while (p != uVar16);
            }
            dVar29 = fact[uVar20];
            dVar4 = pow(b * R,(double)iVar10);
            dVar4 = dVar4 * (((double)(int)(uVar11 - iVar10) * dVar3) / dVar29);
            dVar24 = dVar24 + dVar4;
            if (ABS(dVar4) < dVar1 / ABS(dVar8)) break;
            uVar20 = uVar20 + 1;
            uVar16 = uVar16 + 1;
            local_98 = local_98 + 1;
          } while (uVar20 != uVar22);
        }
        dVar8 = dVar8 * dVar24;
      }
      else {
        puts("WARNING: b = 0 in sSTOCoulInt");
        dVar8 = 0.0;
      }
    }
    else {
      dVar8 = (-a * dVar6) / (dVar8 * dVar3);
      dVar6 = 0.0;
      dVar29 = 0.0;
      if (0 < n) {
        uVar22 = 1;
        if (1 < n * 2) {
          uVar22 = (ulong)(uint)(n * 2);
        }
        iVar10 = uVar9 - 1;
        uVar20 = 0;
        do {
          iVar19 = (int)uVar20;
          dVar29 = fact[uVar20];
          dVar4 = pow(a * R,(double)iVar19);
          dVar4 = dVar4 * (((dVar3 + dVar3) - (double)iVar19) / dVar29);
          iVar21 = (iVar19 - (iVar19 + -1 >> 0x1f)) + -1 >> 1;
          uVar11 = iVar21 + m;
          uVar16 = uVar11 >> 0x1f;
          if ((int)uVar11 < 0) {
            dVar27 = 0.0;
          }
          else {
            dVar27 = 0.0;
            iVar14 = 0;
            iVar17 = iVar10;
            do {
              RVar5 = RosenD(iVar15,iVar19,iVar14 * 2);
              dVar29 = 1.0;
              dVar30 = 1.0;
              if (0 < (int)(~(iVar14 * 2) + uVar9 + iVar19)) {
                dVar28 = 1.0;
                dVar30 = 1.0;
                iVar12 = iVar17;
                do {
                  dVar28 = dVar28 * (dVar24 / dVar29);
                  dVar30 = dVar30 + dVar28;
                  dVar29 = dVar29 + 1.0;
                  iVar12 = iVar12 + -1;
                } while (iVar12 != 0);
                dVar30 = dVar30 / dVar28;
              }
              dVar29 = exp(dVar23);
              dVar29 = (dVar29 / dVar24) * dVar30 *
                       (RVar5 / ((double)iVar14 + (double)iVar14 + 1.0));
              dVar27 = dVar27 + dVar29;
              if ((0.0 < dVar29) && (dVar29 < dVar1 / ABS(dVar8 * dVar4))) break;
              iVar12 = iVar14 + 1;
              uVar16 = (uint)((int)uVar11 <= iVar14);
              iVar17 = iVar17 + -2;
              iVar14 = iVar12;
            } while (iVar12 != iVar21 + m + 1);
          }
          dVar29 = dVar6;
          if (uVar16 == 0) break;
          dVar6 = dVar6 + dVar27 * dVar4;
          uVar20 = uVar20 + 1;
          iVar10 = iVar10 + 1;
          dVar29 = dVar6;
        } while (uVar20 != uVar22);
      }
      dVar8 = dVar8 * dVar29;
    }
    dVar2 = dVar2 + dVar8;
  }
  else {
    uVar9 = m * 2;
    dVar24 = *(double *)(&DAT_002a4958 + (long)(int)uVar9 * 8);
    dVar2 = pow(dVar8,(double)(int)uVar9);
    if (n < 1) {
      dVar6 = 0.0;
    }
    else {
      uVar11 = n * 2;
      iVar15 = 1;
      uVar22 = 1;
      if (1 < (int)uVar11) {
        uVar22 = (ulong)uVar11;
      }
      dVar6 = 0.0;
      lVar18 = 0;
      do {
        dVar3 = pow(b + b,(double)(n * 2 + -1 + (int)lVar18));
        dVar23 = *(double *)
                  ("N6OpenMD13ElectrostaticE" + lVar18 * 8 + (long)((m + n) * 2) * 8 + 0x14);
        dVar1 = *(double *)(&DAT_002a4958 + lVar18 * 8 + (long)(int)uVar11 * 8);
        dVar29 = pow(a + b + a + b,(double)((m + n) * 2 + -1 + (int)lVar18));
        dVar6 = dVar6 + (dVar3 * (double)iVar15 * dVar23) / (dVar29 * (dVar1 + dVar1) * (double)n);
        lVar18 = lVar18 + -1;
        iVar15 = iVar15 + 1;
      } while (-lVar18 != uVar22);
    }
    dVar8 = pow(dVar8,(double)(int)(uVar9 | 1));
    dVar2 = (dVar8 * (dVar24 / dVar2 - dVar6)) / fact[(int)uVar9];
  }
  return dVar2;
}

Assistant:

inline RealType sSTOCoulInt(RealType a, RealType b, int m, int n, RealType R) {
  RealType x, K2;
  RealType Factor1, Factor2, Term, OneElectronTerm;
  RealType eps, epsi;

  // To speed up calculation, we terminate loop once contributions
  // to integral fall below the bound, epsilon
  RealType epsilon = 0.;

  // x is the argument of the auxiliary RosenA and RosenB functions
  x = 2. * a * R;

  // First compute the two-electron component
  RealType sSTOCoulInt_ = 0.;
  if (std::fabs(x) <
      std::numeric_limits<RealType>::epsilon())  // Pathological case
  {
    // This solution for the one-center coulomb integrals comes from
    // Yoshiyuki Hase, Computers & Chemistry 9(4), pp. 285-287 (1985).

    RealType Term1 = fact[2 * m - 1] / pow(2 * a, 2 * m);
    RealType Term2 = 0.;
    for (int nu = 1; nu <= 2 * n; nu++) {
      Term2 += nu * pow(2 * b, 2 * n - nu) * fact[2 * (m + n) - nu - 1] /
               (fact[2 * n - nu] * 2 * n * pow(2 * (a + b), 2 * (m + n) - nu));
    }
    sSTOCoulInt_ = pow(2 * a, 2 * m + 1) * (Term1 - Term2) / fact[2 * m];

    // Original QTPIE code for the one-center case is below.  Doesn't
    // appear to generate the correct one-center results.
    //
    // if ((a==b) && (m==n))
    //   {
    //     for (int nu=0; nu<=2*n-1; nu++)
    //       {
    //         K2 = 0.;
    //         for (unsigned p=0; p<=2*n+m; p++) K2 += 1. / fact[p];
    //         sSTOCoulInt_ += K2 * fact[2*n+m] / fact[m];
    //       }
    //     sSTOCoulInt_ = 2 * a / (n * fact[2*n]) * sSTOCoulInt_;
    //   }
    // else
    //   {
    //     // Not implemented
    //     printf("ERROR, sSTOCoulInt cannot compute from arguments\n");
    //     printf("a = %lf b = %lf m = %d n = %d R = %lf\n",a, b, m, n, R);
    //     exit(0);
    //   }

  } else {
    OneElectronTerm = 1. / R +
                      pow(x, 2 * m) / (fact[2 * m] * R) *
                          ((x - 2 * m) * RosenA(2 * m - 1, x) - exp(-x)) +
                      sSTOCoulInt_;
    eps = epsilon / OneElectronTerm;
    if (a == b) {
      // Apply Rosen (48)
      Factor1 = -a * pow(a * R, 2 * m) / (n * fact[2 * m]);
      for (int nu = 0; nu <= 2 * n - 1; nu++) {
        Factor2 = (2. * n - nu) / fact[nu] * pow(a * R, nu);
        epsi    = eps / fabs(Factor1 * Factor2);
        K2      = 0.;
        for (int p = 0; p <= m + (nu - 1) / 2; p++) {
          Term = RosenD(2 * m - 1, nu, 2 * p) / (2. * p + 1.) *
                 RosenA(2 * m + nu - 1 - 2 * p, x);
          K2 += Term;
          if ((Term > 0) && (Term < epsi)) goto label1;
        }
        sSTOCoulInt_ += K2 * Factor2;
      }
    label1:
      sSTOCoulInt_ *= Factor1;
    } else {
      Factor1 = -a * pow(a * R, 2 * m) / (2. * n * fact[2 * m]);
      epsi    = eps / fabs(Factor1);
      if (b == 0.)
        printf("WARNING: b = 0 in sSTOCoulInt\n");
      else {
        // Apply Rosen (54)
        for (int nu = 0; nu <= 2 * n - 1; nu++) {
          K2 = 0;
          for (int p = 0; p <= 2 * m + nu - 1; p++)
            K2 = K2 + RosenD(2 * m - 1, nu, p) * RosenB(p, R * (a - b)) *
                          RosenA(2 * m + nu - 1 - p, R * (a + b));
          Term = K2 * (2 * n - nu) / fact[nu] * pow(b * R, nu);
          sSTOCoulInt_ += Term;
          if (fabs(Term) < epsi) goto label2;
        }
      label2:
        sSTOCoulInt_ *= Factor1;
      }
    }
    // Now add the one-electron term from Rosen (47) = Rosen (53)
    sSTOCoulInt_ += OneElectronTerm;
  }
  return sSTOCoulInt_;
}